

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O1

uint8_t __thiscall m6502::RTS(m6502 *this)

{
  byte bVar1;
  ssize_t sVar2;
  size_t in_RCX;
  
  bVar1 = this->stackPointer + 1;
  this->stackPointer = bVar1;
  sVar2 = read(this,bVar1 | 0x100,(void *)0x0,in_RCX);
  this->pc = (ushort)sVar2 & 0xff;
  bVar1 = this->stackPointer + 1;
  this->stackPointer = bVar1;
  sVar2 = read(this,bVar1 | 0x100,(void *)0x0,in_RCX);
  this->pc = ((ushort)(((uint)sVar2 & 0xff) << 8) | this->pc) + 1;
  return '\0';
}

Assistant:

uint8_t RTS()
  {
    ++stackPointer;
    pc = read(0x0100u + stackPointer);
    ++stackPointer;
    pc |= (uint16_t)read(0x0100u + stackPointer) << 8;

    ++pc;
    return 0;
  }